

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_duplicateIdBehaviour_Test::TestBody(Annotator_duplicateIdBehaviour_Test *this)

{
  shared_ptr *psVar1;
  string *psVar2;
  char cVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  ComponentPtr component;
  ModelPtr model;
  VariablePtr variable;
  AssertionResult local_a0;
  long local_90 [2];
  long *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  unsigned_long local_60;
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  CellmlElementType local_14;
  
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"model","");
  libcellml::Model::create((string *)&local_38);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  libcellml::Annotator::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  psVar2 = local_38;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"duplicateId","");
  libcellml::Entity::setId(psVar2);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  psVar2 = local_48;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"duplicateId","");
  libcellml::Entity::setId(psVar2);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"duplicateId","");
  libcellml::Entity::setId(local_28);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_48);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_38);
  libcellml::Annotator::setModel(local_58);
  local_60 = CONCAT44(local_60._4_4_,0xb);
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"duplicateId","");
  libcellml::Annotator::item((string *)&local_80);
  local_14 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_70,"libcellml::CellmlElementType::UNDEFINED",
             "annotator->item(\"duplicateId\")->type()",(CellmlElementType *)&local_60,&local_14);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (local_70._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xd8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_a0._0_8_ != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_a0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_a0._0_8_ + 8))();
      }
      local_a0._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70 = (long *)0x1;
  local_80 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a0,"size_t(1)","annotator->issueCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_80);
  if ((string)local_a0.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_a0.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_a0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xd9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_70 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  psVar1 = local_58;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"duplicateId","");
  uVar4 = libcellml::Annotator::isUnique((string *)psVar1);
  local_70 = (long *)(CONCAT71(local_70._1_7_,uVar4) ^ 1);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (local_70._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(char *)&local_70,"annotator->isUnique(\"duplicateId\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xdb,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80 = (long *)0x3;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"duplicateId","");
  local_60 = libcellml::Annotator::itemCount((string *)local_58);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_70,"size_t(3)","annotator->itemCount(\"duplicateId\")",
             (unsigned_long *)&local_80,&local_60);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (local_70._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xdc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_a0._0_8_ != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_a0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_a0._0_8_ + 8))();
      }
      local_a0._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}